

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setsout.c
# Opt level: O1

void set_sysout(int version,char *sysout_file_name)

{
  int __fd;
  __off_t _Var1;
  ssize_t sVar2;
  int *piVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  IFPAGE ifpage;
  char acStack_118 [18];
  ushort local_106;
  ushort local_102;
  
  pcVar5 = acStack_118;
  pcVar6 = acStack_118;
  iVar7 = (int)acStack_118;
  __fd = open(sysout_file_name,2);
  if (__fd == -1) {
    set_sysout_cold_5();
LAB_00101337:
    pcVar5 = sysout_file_name;
    set_sysout_cold_4();
LAB_0010133c:
    set_sysout_cold_3();
  }
  else {
    sysout_file_name = (char *)0x200;
    iVar7 = __fd;
    _Var1 = lseek(__fd,0x200,0);
    if (_Var1 == -1) goto LAB_00101337;
    iVar7 = __fd;
    sVar2 = read(__fd,acStack_118,0xb0);
    if (sVar2 == -1) goto LAB_0010133c;
    word_swap_page(acStack_118,0x2c);
    pcVar5 = (char *)0x200;
    iVar7 = __fd;
    local_106 = (ushort)version;
    local_102 = (ushort)version;
    _Var1 = lseek(__fd,0x200,0);
    if (_Var1 != -1) {
      iVar7 = __fd;
      sVar2 = write(__fd,acStack_118,0xb0);
      if (sVar2 != -1) {
        close(__fd);
        printf("%d",(ulong)local_102);
        return;
      }
      goto LAB_00101346;
    }
  }
  pcVar6 = pcVar5;
  set_sysout_cold_2();
LAB_00101346:
  set_sysout_cold_1();
  if (iVar7 < 3) {
    pcVar5 = "setsysout version sysout-name";
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0;
    lVar4 = strtol(*(char **)(pcVar6 + 8),(char **)0x0,10);
    if (0 < (int)lVar4 && *piVar3 == 0) {
      set_sysout((int)lVar4,*(char **)(pcVar6 + 0x10));
      exit(0);
    }
    pcVar5 = "version must be an integer > 0.";
  }
  puts(pcVar5);
  return;
}

Assistant:

void set_sysout(int version, char *sysout_file_name) {
  int sysout;    /* SysoutFile descriptor */
  IFPAGE ifpage; /* IFPAGE */
  char errmsg[255];

  /*
   * first read the IFPAGE(InterfacePage)
   */

  /* open SysoutFile */
  sysout = open(sysout_file_name, O_RDWR);
  if (sysout == -1) {
    sprintf(errmsg, "sysout_loader: can't open sysout file: %s", sysout_file_name);
    perror(errmsg);
    exit(-1);
  }
  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }
  /* reads IFPAGE into scratch_page */
  if (read(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("sysout_loader: can't read IFPAGE");
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)&ifpage, (3 + sizeof(IFPAGE)) / 4);
#endif

  ifpage.lversion = version;
  ifpage.minbversion = version;

  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }
  /* reads IFPAGE into scratch_page */
  if (write(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("Can't write IFPAGE");
    exit(-1);
  }

  close(sysout);
  printf("%d", ifpage.minbversion);
}